

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O1

oonf_layer2_data *
oonf_layer2_neigh_query
          (char *ifname,netaddr *l2neigh_addr,oonf_layer2_neighbor_index idx,_Bool get_default)

{
  long lVar1;
  long lVar2;
  long lVar3;
  oonf_layer2_data *poVar4;
  ulong uVar5;
  bool bVar6;
  
  lVar2 = avl_find(&_oonf_layer2_net_tree,ifname);
  if (lVar2 != 0) {
    lVar3 = avl_find(lVar2 + -0x710);
    uVar5 = (ulong)idx;
    if (lVar3 == 0) {
      if (!get_default) {
        return (oonf_layer2_data *)0x0;
      }
    }
    else {
      lVar1 = lVar3 + uVar5 * 0x28;
      if (*(long *)(lVar3 + -0x3f0 + uVar5 * 0x28) == 0) {
        bVar6 = false;
      }
      else {
        bVar6 = *(long *)(lVar1 + -0x3f8) != 0;
      }
      poVar4 = (oonf_layer2_data *)0x0;
      if (bVar6) {
        poVar4 = (oonf_layer2_data *)(lVar1 + -0x410);
      }
      if (!get_default || bVar6) {
        return poVar4;
      }
    }
    if (*(long *)(lVar2 + -0x3f0 + uVar5 * 0x28) != 0) {
      lVar2 = lVar2 + -0x7a0 + uVar5 * 0x28;
      if (*(long *)(lVar2 + 0x3a8) == 0) {
        return (oonf_layer2_data *)0x0;
      }
      return (oonf_layer2_data *)(lVar2 + 0x390);
    }
  }
  return (oonf_layer2_data *)0x0;
}

Assistant:

struct oonf_layer2_data *
oonf_layer2_neigh_query(const char *ifname, const struct netaddr *l2neigh_addr,
      enum oonf_layer2_neighbor_index idx, bool get_default) {
  struct oonf_layer2_net *l2net;
  struct oonf_layer2_neigh *l2neigh;
  struct oonf_layer2_data *data;

  /* query layer2 database about neighbor */
  l2net = oonf_layer2_net_get(ifname);
  if (l2net == NULL) {
    return NULL;
  }

  /* look for neighbor specific data */
  l2neigh = oonf_layer2_neigh_get(l2net, l2neigh_addr);
  if (l2neigh != NULL) {
    data = &l2neigh->data[idx];
    if (oonf_layer2_data_has_value(data)) {
      return data;
    }
  }

  if (!get_default) {
    return NULL;
  }

  /* look for network specific default */
  data = &l2net->neighdata[idx];
  if (oonf_layer2_data_has_value(data)) {
    return data;
  }
  return NULL;
}